

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_xinput2.c
# Opt level: O2

void queue_event(ManyMouseEvent *event)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = (long)input_events_write;
  iVar1 = event->maxval;
  input_events[lVar4].minval = event->minval;
  input_events[lVar4].maxval = iVar1;
  uVar2 = event->device;
  uVar3 = event->item;
  iVar1 = event->value;
  input_events[lVar4].type = event->type;
  input_events[lVar4].device = uVar2;
  input_events[lVar4].item = uVar3;
  input_events[lVar4].value = iVar1;
  input_events_write = (input_events_write + 1) % 0x400;
  if (input_events_write == input_events_read) {
    input_events_read = (input_events_read + 1) % 0x400;
  }
  return;
}

Assistant:

static void queue_event(const ManyMouseEvent *event)
{
    /* copy the event info. We'll process it in ManyMouse_PollEvent(). */
    memcpy(&input_events[input_events_write], event, sizeof (ManyMouseEvent));

    input_events_write = ((input_events_write + 1) % MAX_EVENTS);

    /* Ring buffer full? Lose oldest event. */
    if (input_events_write == input_events_read)
    {
        /* !!! FIXME: we need to not lose mouse buttons here. */
        input_events_read = ((input_events_read + 1) % MAX_EVENTS);
    } /* if */
}